

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_cache.cc
# Opt level: O2

shared_ptr<StorageClient> __thiscall
StorageCache::CreateClient(StorageCache *this,DatanodeInfo *dn_info)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<StorageClient> sVar2;
  int local_1c;
  _func_int **local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  local_1c = *(int *)(in_RDX + 0x14);
  std::make_shared<NarpcStorageClient,int,int>((int *)&local_18,&local_1c);
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_StorageCache = local_18;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->cache_)._M_t._M_impl = _Var1._M_pi;
  local_18 = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  sVar2.super___shared_ptr<StorageClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<StorageClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<StorageClient>)
         sVar2.super___shared_ptr<StorageClient,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<StorageClient> StorageCache::CreateClient(DatanodeInfo dn_info) {
  if (dn_info.storage_class() == 0) {
    return make_shared<NarpcStorageClient>(dn_info.addr(), dn_info.port());
  } else {
    return make_shared<NarpcStorageClient>(dn_info.addr(), dn_info.port());
  }
}